

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int aura_node_buffer_pool_gc_once(aura_node *pos)

{
  int iVar1;
  list_head *plVar2;
  list_head *plVar3;
  list_head *plVar4;
  bool bVar5;
  
  iVar1 = pos->num_buffers_in_pool;
  bVar5 = pos->gc_threshold <= iVar1;
  if (bVar5) {
    pos->num_buffers_in_pool = iVar1 + -1;
    plVar2 = (pos->buffer_pool).prev;
    plVar3 = plVar2->next;
    plVar4 = plVar2->prev;
    plVar3->prev = plVar4;
    plVar4->next = plVar3;
    plVar2->next = (list_head *)0x100100;
    plVar2->prev = (list_head *)0x200200;
    aura_buffer_destroy((aura_buffer *)(plVar2 + -2));
  }
  return (uint)bVar5;
}

Assistant:

int aura_node_buffer_pool_gc_once(struct aura_node *pos)
{
	/* GC: Ditch one last buffer from pool if we have too many */
	if (pos->num_buffers_in_pool >= pos->gc_threshold) {
		struct aura_buffer *buf;
		pos->num_buffers_in_pool--;
		buf = list_entry(pos->buffer_pool.prev, struct aura_buffer, qentry);
		list_del(pos->buffer_pool.prev);
		aura_buffer_destroy(buf);
		return 1;
	}
	return 0;
}